

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O3

void __thiscall
MeshSplitter::UpdateNode
          (MeshSplitter *this,aiNode *pcNode,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *source_mesh_map)

{
  MeshSplitter *this_00;
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aiEntries;
  uint local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  MeshSplitter *local_38;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_38 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_58,(ulong)(pcNode->mNumMeshes + 1));
  uVar4 = pcNode->mNumMeshes;
  if (uVar4 != 0) {
    uVar2 = 0;
    do {
      local_5c = 0;
      uVar3 = (uint)((ulong)((long)(source_mesh_map->
                                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(source_mesh_map->
                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4);
      if (uVar3 != 0) {
        do {
          if ((source_mesh_map->
              super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start[local_5c].second == pcNode->mMeshes[uVar2])
          {
            if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                         (iterator)
                         local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_5c);
            }
            else {
              *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_5c;
              local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          local_5c = local_5c + 1;
        } while (local_5c < uVar3);
        uVar4 = pcNode->mNumMeshes;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar4);
  }
  operator_delete(pcNode->mMeshes,4);
  uVar4 = (uint)((ulong)((long)local_58.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  pcNode->mNumMeshes = uVar4;
  puVar1 = (uint *)operator_new__((long)local_58.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_58.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start & 0x3fffffffc);
  this_00 = local_38;
  pcNode->mMeshes = puVar1;
  if (uVar4 != 0) {
    uVar2 = 0;
    do {
      pcNode->mMeshes[uVar2] =
           local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar2 < pcNode->mNumMeshes);
  }
  uVar4 = pcNode->mNumChildren;
  if ((ulong)uVar4 != 0) {
    uVar2 = 0;
    do {
      UpdateNode(this_00,pcNode->mChildren[uVar2],source_mesh_map);
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MeshSplitter::UpdateNode(aiNode* pcNode, const std::vector<std::pair<aiMesh*, unsigned int> >& source_mesh_map) {
	// TODO: should better use std::(multi)set for source_mesh_map.

	// for every index in out list build a new entry
	std::vector<unsigned int> aiEntries;
	aiEntries.reserve(pcNode->mNumMeshes + 1);
	for (unsigned int i = 0; i < pcNode->mNumMeshes;++i)	{
		for (unsigned int a = 0, end = static_cast<unsigned int>(source_mesh_map.size()); a < end;++a)	{
			if (source_mesh_map[a].second == pcNode->mMeshes[i])	{
				aiEntries.push_back(a);
			}
		}
	}

	// now build the new list
	delete pcNode->mMeshes;
	pcNode->mNumMeshes = static_cast<unsigned int>(aiEntries.size());
	pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];

	for (unsigned int b = 0; b < pcNode->mNumMeshes;++b) {
		pcNode->mMeshes[b] = aiEntries[b];
	}

	// recursively update children
	for (unsigned int i = 0, end = pcNode->mNumChildren; i < end;++i)	{
		UpdateNode ( pcNode->mChildren[i], source_mesh_map );
	}
	return;
}